

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_put_test.cc
# Opt level: O3

void __thiscall IntegrationTest_TestIoPut_Test::TestBody(IntegrationTest_TestIoPut_Test *this)

{
  undefined8 *puVar1;
  long *plVar2;
  uint uVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 uVar6;
  char *pcVar7;
  Qiniu_Error QVar8;
  long httpCode;
  char text_1 [14];
  char text [14];
  Qiniu_RS_GetPolicy getPolicy;
  Qiniu_Io_PutRet putRet;
  Qiniu_Client client_1;
  char key [100];
  Qiniu_Client client;
  AssertHelper local_300;
  AssertHelper local_2f8;
  AssertHelper local_2f0;
  internal local_2e8;
  undefined5 uStack_2e7;
  undefined2 uStack_2e2;
  undefined6 local_2e0;
  undefined2 uStack_2da;
  int local_2d8 [2];
  char *local_2d0;
  char *local_2c8;
  Message local_2c0;
  undefined6 uStack_2b8;
  Qiniu_RS_GetPolicy local_2ac;
  Qiniu_Buffer local_2a8;
  Qiniu_Client local_288;
  char local_1e8 [112];
  Qiniu_Client local_178;
  Qiniu_RS_PutPolicy local_d8;
  
  uVar3 = rand();
  snprintf(local_1e8,100,"key_%d",(ulong)uVar3);
  Qiniu_Client_InitMacAuth(&local_178,0x400,(Qiniu_Mac *)0x0);
  Qiniu_Client_SetTimeout(&local_178,5000);
  Qiniu_Client_SetConnectTimeout(&local_178,3000);
  Qiniu_Client_EnableAutoQuery(&local_178,1);
  memset(&local_d8.saveKey,0,0xa0);
  local_d8.scope = Test_bucket;
  pcVar4 = Qiniu_RS_PutPolicy_Token(&local_d8,(Qiniu_Mac *)0x0);
  Qiniu_RS_Delete(&local_178,Test_bucket,local_1e8);
  local_2a8.buf = (char *)0x0;
  local_2a8.curr = (char *)0x0;
  local_2a8.bufEnd = (char *)0x0;
  Qiniu_Client_InitNoAuth(&local_288,0x400);
  Qiniu_Client_EnableAutoQuery(&local_288,1);
  QVar8 = Qiniu_Io_PutFile(&local_288,(Qiniu_Io_PutRet *)&local_2a8,pcVar4,local_1e8,
                           "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
                           ,(Qiniu_Io_PutExtra *)0x0);
  local_2d0 = QVar8.message;
  local_2d8[0] = QVar8.code;
  local_2c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 200;
  testing::internal::CmpHelperEQ<int,int>(&local_2e8,"err.code","200",local_2d8,(int *)&local_2c0);
  if (local_2e8 == (internal)0x0) {
    testing::Message::Message(&local_2c0);
    if ((undefined8 *)CONCAT26(uStack_2da,local_2e0) == (undefined8 *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)CONCAT26(uStack_2da,local_2e0);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x15,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2f8,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper(&local_2f8);
    plVar2 = (long *)CONCAT26(local_2c0.ss_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._6_2_,
                              CONCAT24(local_2c0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._4_2_,
                                       local_2c0.ss_._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl._0_4_));
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
  }
  puVar1 = (undefined8 *)CONCAT26(uStack_2da,local_2e0);
  local_2c8 = pcVar4;
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  pcVar4 = Qiniu_Buffer_CStr(&local_288.respHeader);
  Qiniu_Stderr_Debug("%s",pcVar4);
  pcVar4 = "";
  pcVar7 = local_2a8.buf;
  if (local_2a8.buf == (char *)0x0) {
    pcVar7 = "";
  }
  Qiniu_Stderr_Debug("hash: %s",pcVar7);
  Qiniu_Client_Cleanup(&local_288);
  Qiniu_RS_Delete(&local_178,Test_bucket,local_1e8);
  uStack_2b8 = 0x21646c726f;
  local_2c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0x6c6c6548;
  local_2c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_2_ = 0x2c6f;
  local_2c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_2_ = 0x7720;
  local_2a8.bufEnd = (char *)0x0;
  local_2a8.buf = (char *)0x0;
  local_2a8.curr = (char *)0x0;
  Qiniu_Client_InitNoAuth(&local_288,0x400);
  Qiniu_Client_EnableAutoQuery(&local_288,1);
  pcVar7 = local_2c8;
  QVar8 = Qiniu_Io_PutBuffer(&local_288,(Qiniu_Io_PutRet *)&local_2a8,local_2c8,local_1e8,
                             (char *)&local_2c0,0xd,(Qiniu_Io_PutExtra *)0x0);
  local_2d0 = QVar8.message;
  local_2d8[0] = QVar8.code;
  pcVar5 = Qiniu_Buffer_CStr(&local_288.respHeader);
  Qiniu_Stderr_Debug("%s",pcVar5);
  pcVar5 = local_2a8.buf;
  if (local_2a8.buf == (char *)0x0) {
    pcVar5 = "";
  }
  Qiniu_Stderr_Debug("hash: %s",pcVar5);
  local_2f8.data_._0_4_ = 200;
  testing::internal::CmpHelperEQ<int,int>(&local_2e8,"err.code","200",local_2d8,(int *)&local_2f8);
  if (local_2e8 == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if ((undefined8 *)CONCAT26(uStack_2da,local_2e0) != (undefined8 *)0x0) {
      pcVar4 = *(char **)CONCAT26(uStack_2da,local_2e0);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x2e,pcVar4);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if ((long *)CONCAT44(local_2f8.data_._4_4_,local_2f8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2f8.data_._4_4_,local_2f8.data_._0_4_) + 8))();
    }
  }
  puVar1 = (undefined8 *)CONCAT26(uStack_2da,local_2e0);
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  testing::internal::CmpHelperSTREQ
            (&local_2e8,"putRet.hash","\"FpQ6cC0G80WZruH42o759ylgMdaZ\"",local_2a8.buf,
             "FpQ6cC0G80WZruH42o759ylgMdaZ");
  if (local_2e8 == (internal)0x0) {
    testing::Message::Message((Message *)&local_2f8);
    if ((undefined8 *)CONCAT26(uStack_2da,local_2e0) == (undefined8 *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)CONCAT26(uStack_2da,local_2e0);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_300,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x2f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_300,(Message *)&local_2f8);
    testing::internal::AssertHelper::~AssertHelper(&local_300);
    if ((long *)CONCAT44(local_2f8.data_._4_4_,local_2f8.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_2f8.data_._4_4_,local_2f8.data_._0_4_) + 8))();
    }
  }
  puVar1 = (undefined8 *)CONCAT26(uStack_2da,local_2e0);
  if (puVar1 != (undefined8 *)0x0) {
    if ((undefined8 *)*puVar1 != puVar1 + 2) {
      operator_delete((undefined8 *)*puVar1);
    }
    operator_delete(puVar1);
  }
  Qiniu_Client_Cleanup(&local_288);
  Qiniu_Free(pcVar7);
  local_2ac.expires = 0;
  local_2c8 = Qiniu_RS_MakeBaseUrl(Test_Domain,local_1e8);
  pcVar4 = Qiniu_RS_GetPolicy_MakeRequest(&local_2ac,local_2c8,(Qiniu_Mac *)0x0);
  local_2e0 = 0x21646c726f;
  local_2e8 = (internal)0x48;
  uStack_2e7 = 0x2c6f6c6c65;
  uStack_2e2 = 0x7720;
  uVar6 = curl_easy_init();
  Qiniu_Buffer_Init((Qiniu_Buffer *)&local_288,0x400);
  Qiniu_Buffer_Init(&local_2a8,0x400);
  Qiniu_Stderr_Debug("url: %s",pcVar4);
  curl_easy_setopt(uVar6,0x2712,pcVar4);
  curl_easy_setopt(uVar6,0x4e2b,Qiniu_Buffer_Fwrite);
  curl_easy_setopt(uVar6,0x2711,&local_288);
  curl_easy_setopt(uVar6,0x4e6f,Qiniu_Buffer_Fwrite);
  curl_easy_setopt(uVar6,0x272d,&local_2a8);
  local_2c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = curl_easy_perform(uVar6);
  local_2c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_2_ = 0;
  local_2c0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._6_2_ = 0;
  pcVar7 = Qiniu_Buffer_CStr(&local_2a8);
  Qiniu_Stderr_Debug("%s",pcVar7);
  local_300.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_2d8,"code","0",(long *)&local_2c0,(int *)&local_300);
  if (local_2d8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_2d0 == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x4b,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) + 8))();
    }
  }
  pcVar7 = local_2d0;
  if (local_2d0 != (char *)0x0) {
    if (*(char **)local_2d0 != local_2d0 + 0x10) {
      operator_delete(*(char **)local_2d0);
    }
    operator_delete(pcVar7);
  }
  curl_easy_getinfo(uVar6,0x200002,&local_2f8);
  local_300.data_._0_4_ = 200;
  testing::internal::CmpHelperEQ<long,int>
            ((internal *)local_2d8,"httpCode","200",(long *)&local_2f8,(int *)&local_300);
  if (local_2d8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_2d0 == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x4e,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) + 8))();
    }
  }
  pcVar7 = local_2d0;
  if (local_2d0 != (char *)0x0) {
    if (*(char **)local_2d0 != local_2d0 + 0x10) {
      operator_delete(*(char **)local_2d0);
    }
    operator_delete(pcVar7);
  }
  pcVar7 = Qiniu_Buffer_CStr((Qiniu_Buffer *)&local_288);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_2d8,"Qiniu_Buffer_CStr(&resp)","text",pcVar7,(char *)&local_2e8);
  if (local_2d8[0]._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_300);
    if (local_2d0 == (char *)0x0) {
      pcVar7 = "";
    }
    else {
      pcVar7 = *(char **)local_2d0;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/io_put_test.cc"
               ,0x50,pcVar7);
    testing::internal::AssertHelper::operator=(&local_2f0,(Message *)&local_300);
    testing::internal::AssertHelper::~AssertHelper(&local_2f0);
    if ((long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_300.data_._4_4_,local_300.data_._0_4_) + 8))();
    }
  }
  pcVar7 = local_2d0;
  if (local_2d0 != (char *)0x0) {
    if (*(char **)local_2d0 != local_2d0 + 0x10) {
      operator_delete(*(char **)local_2d0);
    }
    operator_delete(pcVar7);
  }
  curl_easy_cleanup(uVar6);
  Qiniu_Free(pcVar4);
  Qiniu_Free(local_2c8);
  Qiniu_Client_Cleanup(&local_178);
  return;
}

Assistant:

TEST(IntegrationTest, TestIoPut)
{
	Qiniu_Client client;
	Qiniu_RS_PutPolicy putPolicy;
	Qiniu_RS_GetPolicy getPolicy;
	char *uptoken;
	char *dnBaseUrl;
	char *dnRequest;
	char key[100];
	Qiniu_snprintf(key, 100, "key_%d", rand());

	Qiniu_Client_InitMacAuth(&client, 1024, NULL);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	Qiniu_Zero(putPolicy);
	putPolicy.scope = Test_bucket;
	uptoken = Qiniu_RS_PutPolicy_Token(&putPolicy, NULL);

	Qiniu_RS_Delete(&client, Test_bucket, key);
	clientIoPutFile(uptoken, key);

	Qiniu_RS_Delete(&client, Test_bucket, key);
	clientIoPutBuffer(uptoken, key);

	Qiniu_Free(uptoken);

	Qiniu_Zero(getPolicy);
	dnBaseUrl = Qiniu_RS_MakeBaseUrl(Test_Domain, key);
	dnRequest = Qiniu_RS_GetPolicy_MakeRequest(&getPolicy, dnBaseUrl, NULL);

	clientIoGet(dnRequest);

	Qiniu_Free(dnRequest);
	Qiniu_Free(dnBaseUrl);

	Qiniu_Client_Cleanup(&client);
}